

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<duckdb::hugeint_t>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  char *__filename;
  bool bVar1;
  hugeint_t *__y;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  _func_int **in_stack_ffffffffffffffb8;
  QuantileCursor<duckdb::hugeint_t> *in_stack_ffffffffffffffc0;
  ulong local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  for (local_10 = in_RSI; local_10 < local_18; local_10 = local_10 + 1) {
    bVar1 = QuantileIncluded<duckdb::hugeint_t>::operator()
                      ((QuantileIncluded<duckdb::hugeint_t> *)in_stack_ffffffffffffffc0,
                       (idx_t *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      __filename = (char *)*in_RDI;
      __y = QuantileCursor<duckdb::hugeint_t>::operator[]
                      (in_stack_ffffffffffffffc0,(idx_t)in_stack_ffffffffffffffb8);
      std::pair<unsigned_long,_duckdb::hugeint_t>::pair<unsigned_long_&,_true>
                ((pair<unsigned_long,_duckdb::hugeint_t> *)&stack0xffffffffffffffd0,
                 &stack0xfffffffffffffff0,__y);
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
      ::remove((HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                *)&stack0xffffffffffffffb8,__filename);
    }
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}